

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DOMNamedNodeMapImpl.cpp
# Opt level: O0

DOMNode * __thiscall
xercesc_4_0::DOMNamedNodeMapImpl::removeNamedItemNS
          (DOMNamedNodeMapImpl *this,XMLCh *namespaceURI,XMLCh *localName)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  XMLSize_t XVar5;
  DOMNode *p;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  DOMNodeImpl *pDVar6;
  DOMException *pDVar7;
  undefined4 extraout_var_05;
  undefined4 extraout_var_06;
  MemoryManager *local_110;
  DOMDocumentImpl *local_100;
  long local_f0;
  MemoryManager *local_e0;
  DOMNode *local_c0;
  MemoryManager *local_b0;
  DOMDocumentImpl *local_a0;
  long local_90;
  MemoryManager *local_80;
  XMLCh *nLocalName;
  XMLCh *nNamespaceURI;
  DOMNode *n;
  XMLSize_t size;
  XMLSize_t i;
  DOMDocument *doc;
  XMLSize_t index;
  XMLCh *localName_local;
  XMLCh *namespaceURI_local;
  DOMNamedNodeMapImpl *this_local;
  
  bVar1 = readOnly(this);
  if (bVar1) {
    pDVar7 = (DOMException *)__cxa_allocate_exception(0x28);
    if (this->fOwnerNode == (DOMNode *)0x0) {
      local_80 = XMLPlatformUtils::fgMemoryManager;
    }
    else {
      iVar2 = (*this->fOwnerNode->_vptr_DOMNode[0xc])();
      if (CONCAT44(extraout_var,iVar2) == 0) {
        local_90 = 0;
      }
      else {
        local_90 = CONCAT44(extraout_var,iVar2) + -8;
      }
      if (local_90 == 0) {
        local_b0 = XMLPlatformUtils::fgMemoryManager;
      }
      else {
        iVar2 = (*this->fOwnerNode->_vptr_DOMNode[0xc])();
        if (CONCAT44(extraout_var_00,iVar2) == 0) {
          local_a0 = (DOMDocumentImpl *)0x0;
        }
        else {
          local_a0 = (DOMDocumentImpl *)(CONCAT44(extraout_var_00,iVar2) + -8);
        }
        local_b0 = DOMDocumentImpl::getMemoryManager(local_a0);
      }
      local_80 = local_b0;
    }
    DOMException::DOMException(pDVar7,7,0,local_80);
    __cxa_throw(pDVar7,&DOMException::typeinfo,DOMException::~DOMException);
  }
  doc = (DOMDocument *)0x0;
  do {
    if ((DOMDocument *)0xc0 < doc) {
      pDVar7 = (DOMException *)__cxa_allocate_exception(0x28);
      if (this->fOwnerNode == (DOMNode *)0x0) {
        local_e0 = XMLPlatformUtils::fgMemoryManager;
      }
      else {
        iVar2 = (*this->fOwnerNode->_vptr_DOMNode[0xc])();
        if (CONCAT44(extraout_var_05,iVar2) == 0) {
          local_f0 = 0;
        }
        else {
          local_f0 = CONCAT44(extraout_var_05,iVar2) + -8;
        }
        if (local_f0 == 0) {
          local_110 = XMLPlatformUtils::fgMemoryManager;
        }
        else {
          iVar2 = (*this->fOwnerNode->_vptr_DOMNode[0xc])();
          if (CONCAT44(extraout_var_06,iVar2) == 0) {
            local_100 = (DOMDocumentImpl *)0x0;
          }
          else {
            local_100 = (DOMDocumentImpl *)(CONCAT44(extraout_var_06,iVar2) + -8);
          }
          local_110 = DOMDocumentImpl::getMemoryManager(local_100);
        }
        local_e0 = local_110;
      }
      DOMException::DOMException(pDVar7,8,0,local_e0);
      __cxa_throw(pDVar7,&DOMException::typeinfo,DOMException::~DOMException);
    }
    if (this->fBuckets[(long)doc] != (DOMNodeVector *)0x0) {
      iVar2 = (*this->fOwnerNode->_vptr_DOMNode[0xc])();
      XVar5 = DOMNodeVector::size(this->fBuckets[(long)doc]);
      for (size = 0; size < XVar5; size = size + 1) {
        p = DOMNodeVector::elementAt(this->fBuckets[(long)doc],size);
        iVar3 = (*p->_vptr_DOMNode[0x16])();
        iVar4 = (*p->_vptr_DOMNode[0x18])();
        bVar1 = XMLString::equals((XMLCh *)CONCAT44(extraout_var_02,iVar3),namespaceURI);
        if (bVar1) {
          bVar1 = XMLString::equals(localName,(XMLCh *)CONCAT44(extraout_var_03,iVar4));
          if (bVar1) {
LAB_0030179f:
            DOMNodeVector::removeElementAt(this->fBuckets[(long)doc],size);
            local_c0 = (DOMNode *)0x0;
            if (CONCAT44(extraout_var_01,iVar2) != 0) {
              local_c0 = (DOMNode *)(CONCAT44(extraout_var_01,iVar2) + 0x18);
            }
            pDVar6 = xercesc_4_0::castToNodeImpl(p);
            pDVar6->fOwnerNode = local_c0;
            pDVar6 = xercesc_4_0::castToNodeImpl(p);
            DOMNodeImpl::isOwned(pDVar6,false);
            return p;
          }
          if ((XMLCh *)CONCAT44(extraout_var_03,iVar4) == (XMLCh *)0x0) {
            iVar3 = (*p->_vptr_DOMNode[2])();
            bVar1 = XMLString::equals(localName,(XMLCh *)CONCAT44(extraout_var_04,iVar3));
            if (bVar1) goto LAB_0030179f;
          }
        }
      }
    }
    doc = (DOMDocument *)((long)&(doc->super_DOMDocumentRange)._vptr_DOMDocumentRange + 1);
  } while( true );
}

Assistant:

DOMNode *DOMNamedNodeMapImpl::removeNamedItemNS(const XMLCh *namespaceURI,
                                                 const XMLCh *localName)
{
    if (this->readOnly())
        throw DOMException(
        DOMException::NO_MODIFICATION_ALLOWED_ERR, 0, GetDOMNamedNodeMapMemoryManager);

    // the map is indexed using the full name of nodes; to search given a namespace and a local name
    // we have to do a linear search
    for (XMLSize_t index = 0; index < MAP_SIZE; index++) {
        if(fBuckets[index]==0)
            continue;

        DOMDocument *doc = fOwnerNode->getOwnerDocument();
        XMLSize_t i = 0;
        XMLSize_t size = fBuckets[index]->size();
        for (i = 0; i < size; ++i) {
            DOMNode *n=fBuckets[index]->elementAt(i);
            const XMLCh * nNamespaceURI = n->getNamespaceURI();
            const XMLCh * nLocalName = n->getLocalName();
            if (!XMLString::equals(nNamespaceURI, namespaceURI))    //URI not match
                continue;
            else {
                if (XMLString::equals(localName, nLocalName)
                    ||
                    (nLocalName == 0 && XMLString::equals(localName, n->getNodeName()))) {
                    fBuckets[index]->removeElementAt(i);
                    castToNodeImpl(n)->fOwnerNode = doc;
                    castToNodeImpl(n)->isOwned(false);
                    return n;
                }
            }
        }
    }
    throw DOMException(DOMException::NOT_FOUND_ERR, 0, GetDOMNamedNodeMapMemoryManager);
    return 0;
}